

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

int __thiscall
CVmObjTads::getp_set_method(CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_prop_id_t vVar1;
  int iVar2;
  vm_val_t *pvVar3;
  CVmObject *pCVar4;
  vm_val_t *in_RDX;
  undefined4 in_ESI;
  uint *in_RDI;
  vm_val_t mval;
  vm_prop_id_t prop;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  vm_val_t *in_stack_ffffffffffffffb8;
  
  if ((getp_set_method(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_set_method(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_set_method::desc,2);
    __cxa_guard_release(&getp_set_method(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc(in_stack_ffffffffffffffb8,in_RDI,in_stack_ffffffffffffffa8)
  ;
  if (iVar2 == 0) {
    vVar1 = CVmBif::pop_propid_val();
    pvVar3 = CVmStack::get(0);
    switch((int)*(undefined8 *)pvVar3) {
    case 5:
      iVar2 = CVmObjString::is_string_obj(0);
      if (iVar2 == 0) {
        pCVar4 = vm_objp(0);
        iVar2 = (*pCVar4->_vptr_CVmObject[0xe])(pCVar4,0);
        if (iVar2 == 0) {
          err_throw(0);
        }
      }
      break;
    default:
      err_throw(0);
    case 8:
      break;
    case 0xc:
      break;
    case 0x10:
    }
    (**(code **)(*(long *)in_RDI + 0x60))(in_RDI,G_undo_X,in_ESI,vVar1,&stack0xffffffffffffffb8);
    CVmStack::discard();
    vm_val_t::set_nil(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjTads::getp_set_method(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *argc)
{
    /* check arguments: setMethod(&propid, val) */
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   retrieve the property ID and the method value to set (leave the
     *   value on the stack as gc protection) 
     */
    vm_prop_id_t prop = CVmBif::pop_propid_val(vmg0_);
    vm_val_t mval = *G_stk->get(0);

    /* check the type */
    switch (mval.typ)
    {
    case VM_FUNCPTR:
        /* 
         *   a function pointer translates directly to a regular method, by
         *   directly calling the code body 
         */
        mval.typ = VM_CODEOFS;
        break;

    case VM_OBJ:
        /*
         *   We can accept string and invokable objects.  For either one of
         *   these, we store the object reference and mark it as an
         *   execute-on-eval object rather than an ordinary object value.  
         */
        if (CVmObjString::is_string_obj(vmg_ mval.val.obj)
            || vm_objp(vmg_ mval.val.obj)->get_invoker(vmg_ 0))
        {
            /* 
             *   We can handle this object by executing it on evaluation.
             *   Mark it as a special execute-on-eval object rather than an
             *   ordinary object. 
             */
            mval.typ = VM_OBJX;
        }
        else
        {
            /* it's not an acceptable type of object */
            err_throw(VMERR_BAD_TYPE_BIF);
        }
        break;

    case VM_BIFPTR:
        /* built-in function pointer - mark it as an execute-on-eval bif */
        mval.typ = VM_BIFPTRX;
        break;

    case VM_SSTRING:
        /* 
         *   A constant string translates into a self-printing string.
         *   SSTRING and DSTRING have the same data representation, so we
         *   merely need to switch the type to flag it as print-on-eval. 
         */
        mval.typ = VM_DSTRING;
        break;

    default:
        /* other types are not acceptable */
        err_throw(VMERR_BAD_TYPE_BIF);
    }